

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void vocdusave_delwrd(voccxdef *ctx,objnum objn,prpnum typ,int flags,char *wrd)

{
  ushort *puVar1;
  ushort uVar2;
  objucxdef *undoctx;
  uchar *puVar3;
  ushort siz;
  uint16_t tmp;
  
  undoctx = ctx->voccxundo;
  uVar2 = *(ushort *)wrd;
  siz = uVar2 + 5;
  puVar3 = objures(undoctx,'\x05',siz);
  *puVar3 = '\x05';
  puVar3[1] = (uchar)flags;
  puVar3[2] = (uchar)typ;
  *(objnum *)(puVar3 + 3) = objn;
  memcpy(puVar3 + 5,wrd,(ulong)uVar2);
  puVar1 = &undoctx->objucxhead;
  *puVar1 = *puVar1 + siz;
  return;
}

Assistant:

void vocdusave_delwrd(voccxdef *ctx, objnum objn, prpnum typ, int flags,
                      char *wrd)
{
    ushort     wrdsiz;
    uchar     *p;
    objucxdef *uc = ctx->voccxundo;

    /* figure out how much space we need, and reserve it */
    wrdsiz = osrp2(wrd);
    p = objures(uc, OBJUCLI, (ushort)(5 + wrdsiz));

    *p = VOC_UNDO_DELVOC;
    *(p+1) = flags;
    *(p+2) = (uchar)typ;
    oswp2(p+3, objn);
    memcpy(p+5, wrd, (size_t)wrdsiz);

    uc->objucxhead += 5 + wrdsiz;
}